

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O2

void pnga_transpose(Integer g_a,Integer g_b)

{
  undefined8 uVar1;
  int iVar2;
  void *buf;
  long lVar3;
  undefined8 *puVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  Integer atype;
  int local_42c;
  Integer ncol;
  char *ptr_a;
  Integer hi [2];
  Integer lo [2];
  Integer andim;
  Integer btype;
  Integer hib [2];
  Integer lob [2];
  Integer ld [2];
  Integer bndim;
  Integer bdims [7];
  Integer adims [7];
  _iterator_hdl hdl;
  
  pnga_nodeid();
  pnga_nnodes();
  bVar10 = _ga_sync_begin != 0;
  local_42c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar10) {
    pnga_sync();
  }
  if (g_a == g_b) {
    pnga_error("arrays have to be different ",0);
  }
  pnga_inquire(g_a,&atype,&andim,adims);
  pnga_inquire(g_b,&btype,&bndim,bdims);
  if ((bndim != 2) || (andim != 2)) {
    pnga_error("dimension must be 2",0);
  }
  if (atype != btype) {
    pnga_error("array type mismatch ",0);
  }
  pnga_local_iterator_init(g_a,&hdl);
  do {
    iVar2 = pnga_local_iterator_next(&hdl,lo,hi,&ptr_a,ld);
    if (iVar2 == 0) {
      if (local_42c != 0) {
        pnga_sync();
      }
      return;
    }
    lVar7 = (long)*(int *)(BYTE_ARRAY_001cd1e9 + atype * 0x10 + 0x11f);
    buf = ARMCI_Malloc_local(((hi[1] - lo[1]) + 1) * ((hi[0] - lo[0]) + 1) * lVar7);
    hib[0] = hi[1];
    hib[1] = hi[0];
    ncol = (hi[1] - lo[1]) + 1;
    lob[0] = lo[1];
    lob[1] = lo[0];
    lVar9 = hi[0] - lo[0];
    if (hi[0] - lo[0] < 0) {
      lVar9 = -1;
    }
    lVar9 = lVar9 + 1;
    for (lVar6 = 0; lVar6 < ncol; lVar6 = lVar6 + 1) {
      if (atype - 0x3e9U < 0x10) {
        puVar4 = (undefined8 *)(lVar6 * lVar7 + (long)buf);
        lVar3 = ncol * lVar7;
        switch(atype) {
        case 0x3e9:
          for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
            *(undefined4 *)puVar4 = *(undefined4 *)(ptr_a + lVar8 * 4);
            puVar4 = (undefined8 *)((long)puVar4 + lVar3);
          }
          break;
        case 0x3ea:
          for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
            *puVar4 = *(undefined8 *)(ptr_a + lVar8 * 8);
            puVar4 = (undefined8 *)((long)puVar4 + lVar3);
          }
          break;
        case 0x3eb:
          for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
            *(undefined4 *)puVar4 = *(undefined4 *)(ptr_a + lVar8 * 4);
            puVar4 = (undefined8 *)((long)puVar4 + lVar3);
          }
          break;
        case 0x3ec:
          for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
            *puVar4 = *(undefined8 *)(ptr_a + lVar8 * 8);
            puVar4 = (undefined8 *)((long)puVar4 + lVar3);
          }
          break;
        default:
          goto switchD_00111af9_caseD_3ed;
        case 0x3ee:
          for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
            *puVar4 = *(undefined8 *)(ptr_a + lVar8 * 8);
            puVar4 = (undefined8 *)((long)puVar4 + lVar3);
          }
          break;
        case 0x3ef:
          pcVar5 = ptr_a;
          lVar8 = lVar9;
          while (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10) {
            uVar1 = *(undefined8 *)(pcVar5 + 8);
            *puVar4 = *(undefined8 *)pcVar5;
            puVar4[1] = uVar1;
            puVar4 = (undefined8 *)((long)puVar4 + lVar3);
            pcVar5 = pcVar5 + 0x10;
          }
          break;
        case 0x3f8:
          for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
            *puVar4 = *(undefined8 *)(ptr_a + lVar8 * 8);
            puVar4 = (undefined8 *)((long)puVar4 + lVar3);
          }
        }
      }
      else {
switchD_00111af9_caseD_3ed:
        pnga_error("bad type:",atype);
      }
      ptr_a = ptr_a + ld[0] * lVar7;
    }
    pnga_put(g_b,lob,hib,buf,&ncol);
    ARMCI_Free_local(buf);
  } while( true );
}

Assistant:

void pnga_transpose(Integer g_a, Integer g_b)
{
Integer me = pnga_nodeid();
Integer _ld[MAXDIM-1];
Integer nproc = pnga_nnodes(); 
Integer atype, btype, andim, adims[MAXDIM], bndim, bdims[MAXDIM];
Integer lo[2],hi[2],ld[2];
int local_sync_begin,local_sync_end;
Integer num_blocks_a;
char *ptr_tmp, *ptr_a;
_iterator_hdl hdl;

    
    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_sync();

    if(g_a == g_b) pnga_error("arrays have to be different ", 0L);

    pnga_inquire(g_a, &atype, &andim, adims);
    pnga_inquire(g_b, &btype, &bndim, bdims);

    if(bndim != 2 || andim != 2) pnga_error("dimension must be 2",0);
    if(atype != btype ) pnga_error("array type mismatch ", 0L);

#if 1
    pnga_local_iterator_init(g_a, &hdl);
    while (pnga_local_iterator_next(&hdl,lo,hi,&ptr_a,ld)) {
      Integer idx;
      Integer block_dims[MAXDIM];
      Integer nelem, lob[2], hib[2], nrow, ncol;
      int i, size=GAsizeofM(atype);

      nelem = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
#ifdef GA_TRANSPOSE_USE_ARMCI_MEM
{
      size_t bytes = nelem * size;
      ptr_tmp = ARMCI_Malloc_local(bytes);
}
#else
      ptr_tmp = (char *) pnga_malloc(nelem, atype, "transpose_tmp");
#endif

      nrow   = hi[0] -lo[0]+1;
      ncol   = hi[1] -lo[1]+1; 
      nelem  = nrow*ncol;
      lob[0] = lo[1]; lob[1] = lo[0];
      hib[0] = hi[1]; hib[1] = hi[0];
      for(i = 0; i < ncol; i++){
        char *ptr = ptr_tmp + i*size;

        snga_local_transpose(atype, ptr_a, nrow, ncol*size, ptr);
        ptr_a += ld[0]*size;
      }
      pnga_put(g_b, lob, hib, ptr_tmp ,&ncol);
#ifdef GA_TRANSPOSE_USE_ARMCI_MEM
      ARMCI_Free_local(ptr_tmp);
#else
      pnga_free(ptr_tmp);
#endif
    }
#else
    num_blocks_a = pnga_total_blocks(g_a);

    if (num_blocks_a < 0) {
      pnga_distribution(g_a, me, lo, hi);

      if(lo[0]>0){
        Integer nelem, lob[2], hib[2], nrow, ncol;
        int i, size=GAsizeofM(atype);

        nrow   = hi[0] -lo[0]+1;
        ncol   = hi[1] -lo[1]+1; 
        nelem  = nrow*ncol;
        lob[0] = lo[1]; lob[1] = lo[0];
        hib[0] = hi[1]; hib[1] = hi[0];

        /* allocate memory for transposing elements locally */
        ptr_tmp = (char *) ga_malloc(nelem, atype, "transpose_tmp");

        /* get access to local data */
        pnga_access_ptr(g_a, lo, hi, &ptr_a, _ld);

        for(i = 0; i < ncol; i++){
          char *ptr = ptr_tmp + i*size;

          snga_local_transpose(atype, ptr_a, nrow, ncol*size, ptr);
          ptr_a += _ld[0]*size;
        }

        pnga_release(g_a, lo, hi); 

        pnga_put(g_b, lob, hib, ptr_tmp ,&ncol);

        ga_free(ptr_tmp);
      }
    } else {
      Integer idx;
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      Integer nelem, lob[2], hib[2], nrow, ncol;
      int i, size=GAsizeofM(atype);

      /* allocate memory for transposing elements locally */
      pnga_get_block_info(g_a, blocks, block_dims);

      /* Simple block-cyclic data distribution */
      nelem = block_dims[0]*block_dims[1];
      ptr_tmp = (char *) ga_malloc(nelem, atype, "transpose_tmp");
      if (!pnga_uses_proc_grid(g_a)) {
        for (idx = me; idx < num_blocks_a; idx += nproc) {
          pnga_distribution(g_a, idx, lo, hi);
          pnga_access_block_ptr(g_a, idx, &ptr_a, _ld);

          nrow   = hi[0] -lo[0]+1;
          ncol   = hi[1] -lo[1]+1; 
          nelem  = nrow*ncol;
          lob[0] = lo[1]; lob[1] = lo[0];
          hib[0] = hi[1]; hib[1] = hi[0];
          for(i = 0; i < ncol; i++){
            char *ptr = ptr_tmp + i*size;

            snga_local_transpose(atype, ptr_a, nrow, ncol*size, ptr);
            ptr_a += _ld[0]*size;
          }
          pnga_put(g_b, lob, hib, ptr_tmp ,&ncol);

          pnga_release_update_block(g_a, idx);
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer chk;
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM], ichk;

        pnga_get_proc_index(g_a, me, proc_index);
        pnga_get_proc_index(g_a, me, index);
        pnga_get_block_info(g_a, blocks, block_dims);
        pnga_get_proc_grid(g_a, topology);
        /* Verify that processor has data */
        ichk = 1;
        for (i=0; i<andim; i++) {
          if (index[i]<0 || index[i] >= blocks[i]) {
            ichk = 0;
          }
        }

        if (ichk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr_a, _ld);
          while (index[andim-1] < blocks[andim-1]) {
            /* find bounding coordinates of block */
            chk = 1;
            for (i = 0; i < andim; i++) {
              lo[i] = index[i]*block_dims[i]+1;
              hi[i] = (index[i] + 1)*block_dims[i];
              if (hi[i] > adims[i]) hi[i] = adims[i];
              if (hi[i] < lo[i]) chk = 0;
            }
            if (chk) {
              pnga_access_block_grid_ptr(g_a, index, &ptr_a, _ld);
              nrow   = hi[0] -lo[0]+1;
              ncol   = hi[1] -lo[1]+1; 
              nelem  = nrow*ncol;
              lob[0] = lo[1]; lob[1] = lo[0];
              hib[0] = hi[1]; hib[1] = hi[0];
              for(i = 0; i < ncol; i++){
                char *ptr = ptr_tmp + i*size;
                snga_local_transpose(atype, ptr_a, nrow, block_dims[0]*size, ptr);
                ptr_a += _ld[0]*size;
              }
              pnga_put(g_b, lob, hib, ptr_tmp ,&block_dims[0]);
              pnga_release_update_block_grid(g_a, index);
            }
            /* increment index to get next block on processor */
            index[0] += topology[0];
            for (i = 0; i < andim; i++) {
              if (index[i] >= blocks[i] && i<andim-1) {
                index[i] = proc_index[i];
                index[i+1] += topology[i+1];
              }
            }
          }
        }
      }
      ga_free(ptr_tmp);
    }
#endif
    if(local_sync_end)pnga_sync();
}